

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibString.cpp
# Opt level: O3

int lib::string::Upper(State *state)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  String *pSVar4;
  anon_union_16_2_eed97686_for_String_2 *paVar5;
  ulong uVar6;
  string upper;
  StackAPI api;
  string local_58;
  StackAPI local_38;
  
  luna::StackAPI::StackAPI(&local_38,state);
  bVar2 = luna::StackAPI::CheckArgs<luna::ValueT>(&local_38,1,ValueT_String);
  iVar3 = 0;
  if (bVar2) {
    pSVar4 = luna::StackAPI::GetString(&local_38,0);
    uVar1 = pSVar4->length_;
    if ((pSVar4->super_GCObject).field_0x11 == '\0') {
      paVar5 = &pSVar4->field_1;
    }
    else {
      paVar5 = (anon_union_16_2_eed97686_for_String_2 *)(pSVar4->field_1).str_;
    }
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::reserve((ulong)&local_58);
    if ((ulong)uVar1 != 0) {
      uVar6 = 0;
      do {
        toupper((uint)(byte)paVar5->str_buffer_[uVar6]);
        std::__cxx11::string::push_back((char)&local_58);
        uVar6 = uVar6 + 1;
      } while (uVar1 != uVar6);
    }
    luna::StackAPI::PushString(&local_38,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int Upper(luna::State *state)
    {
        luna::StackAPI api(state);
        if (!api.CheckArgs(1, luna::ValueT_String))
            return 0;

        auto str = api.GetString(0);
        auto size = str->GetLength();
        auto c_str = reinterpret_cast<const unsigned char *>(str->GetCStr());

        std::string upper;
        upper.reserve(size);
        for (std::size_t i = 0; i < size; ++i)
            upper.push_back(std::toupper(c_str[i]));

        api.PushString(upper);
        return 1;
    }